

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::addIgnoreCommand_abi_cxx11_(CommandLine *this,string_view value)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  _Optional_payload_base<int> __a;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long in_RSI;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> value_00;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  optional<int> result;
  string error;
  string_view numArgs;
  size_t lastCommaIndex;
  size_t firstCommaIndex;
  char in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string *this_00;
  allocator<char> local_149 [41];
  string *in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef8;
  pointer local_d0;
  char *pcStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined8 local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *local_28;
  undefined8 local_20;
  undefined1 *local_10;
  undefined8 *local_8;
  
  this_00 = in_RDI;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe5f,0xea7257);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe5f,0xea7278);
  if ((sVar2 == 0xffffffffffffffff) || (sVar2 != sVar3)) {
    local_28 = "missing or extra comma in argument \'{}\'";
    local_20 = 0x27;
    local_30 = &local_88;
    local_40 = "missing or extra comma in argument \'{}\'";
    local_38 = 0x27;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffe70,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_8 = &local_50;
    local_10 = local_68;
    local_50 = 0xd;
    local_48 = local_10;
    ::fmt::v11::vformat_abi_cxx11_(stack0x000000d0,(format_args)error._8_16_);
  }
  else {
    pbVar5 = &local_88;
    value_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)pbVar5,
                          (size_type)in_stack_fffffffffffffe78,(size_type)in_stack_fffffffffffffe70)
    ;
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)pbVar5,
                       (size_type)in_stack_fffffffffffffe78,(size_type)in_stack_fffffffffffffe70);
    local_d0 = (pointer)bVar6._M_len;
    pcStack_c8 = bVar6._M_str;
    local_88._M_dataplus._M_p = local_d0;
    local_88._M_string_length = (size_type)pcStack_c8;
    std::__cxx11::string::string(in_stack_fffffffffffffe70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
               (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    __a = (_Optional_payload_base<int>)
          parseInt<int>(in_stack_fffffffffffffef8,value_00,in_stack_fffffffffffffee0);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0xea7483);
    if (bVar1) {
      piVar4 = std::optional<int>::operator*((optional<int> *)0xea7499);
      iVar7 = *piVar4;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (this_00,(basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                 (allocator<char> *)__a);
      in_stack_fffffffffffffe60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)this_00,in_RDI);
      *(int *)&(in_stack_fffffffffffffe60->_M_dataplus)._M_p = iVar7;
      std::__cxx11::string::~string(in_stack_fffffffffffffe60);
      std::allocator<char>::~allocator(local_149);
      std::__cxx11::string::string(pbVar5);
    }
    else {
      std::__cxx11::string::string(pbVar5,in_stack_fffffffffffffe78);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffe60);
  }
  return this_00;
}

Assistant:

std::string CommandLine::addIgnoreCommand(std::string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == std::string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const std::string_view numArgs = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);

    std::string error;
    auto result = parseInt<int>("", numArgs, error);
    if (result) {
        cmdIgnore[std::string(value)] = *result;
        return {};
    }
    return error;
}